

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.c
# Opt level: O2

sptr_t tga_write(sptr_t buf,image_data image,int expand)

{
  uchar *__dest;
  long lVar1;
  ulong uVar2;
  uchar uVar3;
  ulong uVar4;
  long lVar5;
  uchar *__s;
  long lVar6;
  uchar uVar7;
  uchar *puVar8;
  bool bVar9;
  sptr_t sVar10;
  sptr_t sVar11;
  uchar *local_38;
  
  uVar4 = buf.size;
  __s = buf.ptr;
  uVar2 = 0;
  puVar8 = (uchar *)0x0;
  if (((0xfd < (byte)(image.type - 3)) && (image.palette.data.ptr != (uchar *)0x0)) &&
     (image.palette.type == '\x01')) {
    if (expand == 0) {
      lVar1 = image.pixels.size + 0x312;
    }
    else {
      lVar1 = (4 - (ulong)(image.alpha_pixels == 0)) * image.pixels.size + 0x12;
    }
    uVar2 = 0;
    puVar8 = (uchar *)0x0;
    if (lVar1 - 1U < uVar4) {
      memset(__s,0,uVar4);
      bVar9 = expand == 0;
      *__s = '\0';
      __s[1] = bVar9;
      uVar3 = '\x18';
      if (!bVar9) {
        uVar3 = '\0';
      }
      __s[2] = '\x02' - bVar9;
      local_38 = __s + 3;
      write_le16(0,&local_38);
      write_le16((ushort)bVar9 << 8,&local_38);
      *local_38 = uVar3;
      local_38 = local_38 + 1;
      write_le16(0,&local_38);
      write_le16(0,&local_38);
      write_le16((uint16_t)image.width,&local_38);
      write_le16((uint16_t)image.height,&local_38);
      __dest = __s + 0x12;
      uVar3 = '\b';
      if (expand != 0) {
        uVar3 = (image.alpha_pixels != 0) * '\b' + '\x18';
      }
      *local_38 = uVar3;
      local_38[1] = ' ';
      uVar2 = uVar4;
      puVar8 = __s;
      if (expand == 0) {
        memcpy(__dest,image.palette.data.ptr,image.palette.data.size);
        sVar10.size = uVar4 - 0x12;
        sVar10.ptr = __dest;
        sVar10 = sptr_slice(sVar10,0,image.palette.data.size);
        flip_bgr(sVar10);
        memcpy(__dest + image.palette.data.size,image.pixels.ptr,image.pixels.size);
      }
      else {
        uVar4 = 0;
        if (0 < (int)image.pixels.size) {
          uVar4 = image.pixels.size & 0xffffffff;
        }
        if (image.alpha_pixels == 0) {
          for (lVar1 = 0; uVar4 * 3 != lVar1; lVar1 = lVar1 + 3) {
            lVar5 = (ulong)*image.pixels.ptr * 3;
            __s[lVar1 + 0x12] = image.palette.data.ptr[lVar5 + 2];
            __s[lVar1 + 0x13] = image.palette.data.ptr[lVar5 + 1];
            __s[lVar1 + 0x14] = image.palette.data.ptr[lVar5];
            image.pixels.ptr = image.pixels.ptr + 1;
          }
        }
        else {
          lVar5 = 0;
          for (lVar1 = 0; uVar4 * 4 != lVar1; lVar1 = lVar1 + 4) {
            if ((ulong)*image.pixels.ptr == 0xff) {
              (__s + lVar1 + 0x12)[0] = '\0';
              (__s + lVar1 + 0x12)[1] = '\0';
              uVar3 = '\0';
              uVar7 = '\0';
              lVar6 = lVar1;
            }
            else {
              lVar6 = (ulong)*image.pixels.ptr * 3;
              __s[lVar1 + 0x12] = image.palette.data.ptr[lVar6 + 2];
              __s[lVar1 + 0x13] = image.palette.data.ptr[lVar6 + 1];
              uVar3 = image.palette.data.ptr[lVar6];
              uVar7 = 0xff;
              lVar6 = lVar5 * 4;
            }
            __s[lVar6 + 0x14] = uVar3;
            __s[lVar6 + 0x15] = uVar7;
            lVar5 = lVar5 + 1;
            image.pixels.ptr = image.pixels.ptr + 1;
          }
        }
      }
    }
  }
  sVar11.size = uVar2;
  sVar11.ptr = puVar8;
  return sVar11;
}

Assistant:

sptr_t tga_write(sptr_t buf, struct image_data image, int expand)
{
	size_t size = tga_estimate_size(image, expand);
	if (size == 0 || buf.size < size) {
		return SPTR_NULL;
	}
	memset(buf.ptr, 0, buf.size);
	sptr_t cm_offset = tga_write_header(buf, image, expand);
	if (!expand)
	{
		/* copy palette data */
		memcpy(cm_offset.ptr, image.palette.data.ptr, image.palette.data.size);
		/* flip from RGB to BGR in place */
		sptr_t cm_palette = sptr_slice(cm_offset, 0, image.palette.data.size);
		flip_bgr(cm_palette);
		/* copy pixel data */
		memcpy(cm_offset.ptr + image.palette.data.size, image.pixels.ptr,
			image.pixels.size);
	}
	else
	{
		unsigned char *buf = cm_offset.ptr;
		int num_pixels = image.pixels.size;
		if (image.alpha_pixels)
		{
			/* write BGRA */
			for (int i = 0; i < num_pixels; i++)
			{
				int j = image.pixels.ptr[i];

				if (j == 255)
				{
					// transparent, so scan around for another color
				    // to avoid alpha fringes
				    // FIXME: do a full flood fill so mips work...
					/*
				    if (i > image.width && image.pixels.ptr[i-image.width] != 255)
					    j = image.pixels.ptr[i-image.width];
				    else if (i < num_pixels-image.width && image.pixels.ptr[i+image.width] != 255)
					    j = image.pixels.ptr[i+image.width];
				    else if (i > 0 && image.pixels.ptr[i-1] != 255)
					    j = image.pixels.ptr[i-1];
				    else if (i < num_pixels-1 && image.pixels.ptr[i+1] != 255)
					    j = image.pixels.ptr[i+1];
				    else
					    j = 0;

					buf[i * 4 + 0] = image.palette.data.ptr[j * 3 + 2];
					buf[i * 4 + 1] = image.palette.data.ptr[j * 3 + 1];
					buf[i * 4 + 2] = image.palette.data.ptr[j * 3 + 0];
					*/
					buf[i * 4 + 0] = 0;
					buf[i * 4 + 1] = 0;
					buf[i * 4 + 2] = 0;
					buf[i * 4 + 3] = 0;
				}
				else
				{
					buf[i * 4 + 0] = image.palette.data.ptr[j * 3 + 2];
					buf[i * 4 + 1] = image.palette.data.ptr[j * 3 + 1];
					buf[i * 4 + 2] = image.palette.data.ptr[j * 3 + 0];
					buf[i * 4 + 3] = 255;
				}
			}
		}
		else
		{
			/* write BGR */
			for (int i = 0; i < num_pixels; i++)
			{
				int j = image.pixels.ptr[i] * 3;

				buf[i * 3 + 0] = image.palette.data.ptr[j + 2];
				buf[i * 3 + 1] = image.palette.data.ptr[j + 1];
				buf[i * 3 + 2] = image.palette.data.ptr[j + 0];
			}
		}
	}
	return buf;
}